

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
          (internal *this,char *lhs_expression,char *rhs_expression,char (*lhs) [24],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  iVar1 = std::__cxx11::string::compare((char *)rhs);
  if (iVar1 == 0) {
    testing::AssertionSuccess();
    sVar2.ptr_ = extraout_RDX;
  }
  else {
    AVar3 = CmpHelperEQFailure<char[24],std::__cxx11::string>
                      (this,lhs_expression,rhs_expression,lhs,rhs);
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}